

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Config::readBazelEnvVars(Config *this)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  bazelShardingOptions *pbVar4;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ofstream f;
  Optional<Catch::(anonymous_namespace)::bazelShardingOptions> bazelShardOptions;
  char *bazelTestSpec;
  char *bazelOutputFile;
  value_type *in_stack_fffffffffffffba8;
  ReporterSpec *in_stack_fffffffffffffbb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  allocator<char> *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffbf0;
  string *in_stack_fffffffffffffbf8;
  ReporterSpec *in_stack_fffffffffffffc00;
  ostream local_3c8 [512];
  Optional<Catch::(anonymous_namespace)::bazelShardingOptions> local_1c8;
  allocator<char> local_191;
  string local_190 [32];
  char *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  Optional<Catch::ColourMode> local_130;
  allocator<char> local_119;
  string local_118 [95];
  allocator<char> local_b9;
  string local_b8 [168];
  char *local_10;
  
  local_10 = Detail::getEnv((char *)0x17859b);
  if (local_10 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbf0,
               (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               in_stack_fffffffffffffbe0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbf0,
               (char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               in_stack_fffffffffffffbe0);
    Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Optional((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8);
    Optional<Catch::ColourMode>::Optional(&local_130);
    local_148 = 0;
    uStack_140 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_168 = 0;
    uStack_160 = 0;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x178683);
    ReporterSpec::ReporterSpec
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
               (Optional<Catch::ColourMode> *)
               CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffbe0);
    std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::push_back
              ((vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_> *)
               in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    ReporterSpec::~ReporterSpec(in_stack_fffffffffffffbb0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x1786dd);
    Optional<Catch::ColourMode>::~Optional((Optional<Catch::ColourMode> *)0x1786ea);
    Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Optional((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x1786f7);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  local_170 = Detail::getEnv((char *)0x178831);
  if (local_170 != (char *)0x0) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xe8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x178861);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
               in_stack_fffffffffffffbe0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffbb0,&in_stack_fffffffffffffba8->m_name);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator(&local_191);
  }
  anon_unknown_26::readBazelShardingOptions();
  bVar1 = Catch::Optional::operator_cast_to_bool
                    ((Optional<Catch::(anonymous_namespace)::bazelShardingOptions> *)0x17892e);
  if (bVar1) {
    pbVar4 = Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::operator->(&local_1c8);
    _Var3 = std::operator|(_S_out,_S_trunc);
    std::ofstream::ofstream(local_3c8,(string *)&pbVar4->shardFilePath,_Var3);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) != 0) {
      std::operator<<(local_3c8,"");
      pbVar4 = Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::operator->(&local_1c8);
      *(uint *)(in_RDI + 0x20) = pbVar4->shardIndex;
      pbVar4 = Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::operator->(&local_1c8);
      *(uint *)(in_RDI + 0x1c) = pbVar4->shardCount;
    }
    std::ofstream::~ofstream(local_3c8);
  }
  Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::~Optional
            ((Optional<Catch::(anonymous_namespace)::bazelShardingOptions> *)0x178a68);
  return;
}

Assistant:

void Config::readBazelEnvVars() {
        // Register a JUnit reporter for Bazel. Bazel sets an environment
        // variable with the path to XML output. If this file is written to
        // during test, Bazel will not generate a default XML output.
        // This allows the XML output file to contain higher level of detail
        // than what is possible otherwise.
        const auto bazelOutputFile = Detail::getEnv( "XML_OUTPUT_FILE" );

        if ( bazelOutputFile ) {
            m_data.reporterSpecifications.push_back(
                { "junit", std::string( bazelOutputFile ), {}, {} } );
        }

        const auto bazelTestSpec = Detail::getEnv( "TESTBRIDGE_TEST_ONLY" );
        if ( bazelTestSpec ) {
            // Presumably the test spec from environment should overwrite
            // the one we got from CLI (if we got any)
            m_data.testsOrTags.clear();
            m_data.testsOrTags.push_back( bazelTestSpec );
        }

        const auto bazelShardOptions = readBazelShardingOptions();
        if ( bazelShardOptions ) {
            std::ofstream f( bazelShardOptions->shardFilePath,
                             std::ios_base::out | std::ios_base::trunc );
            if ( f.is_open() ) {
                f << "";
                m_data.shardIndex = bazelShardOptions->shardIndex;
                m_data.shardCount = bazelShardOptions->shardCount;
            }
        }
    }